

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void inblock(char *s)

{
  byte bVar1;
  ushort *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ushort **ppuVar6;
  Item *pIVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char test [30];
  char word [100];
  char local_b8 [32];
  char local_98 [104];
  
  iVar3 = linenum;
  do {
    pcVar10 = buf;
    while( true ) {
      iVar5 = Getc();
      if (iVar5 == 10) break;
      if (iVar5 == -1) {
        linenum = iVar3;
        diag(s," block goes to end of file");
      }
      *pcVar10 = (char)iVar5;
      pcVar10 = pcVar10 + 1;
    }
    pcVar10[0] = '\n';
    pcVar10[1] = '\0';
    sprintf(local_b8,"END%s",s);
    pcVar10 = buf;
    while( true ) {
      bVar1 = *pcVar10;
      uVar9 = (ulong)bVar1;
      if ((bVar1 != 0x20) && (bVar1 != 9)) break;
      pcVar10 = (char *)((byte *)pcVar10 + 1);
    }
    ppuVar6 = __ctype_b_loc();
    puVar2 = *ppuVar6;
    if ((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 4) != 0) {
      lVar4 = 0;
      do {
        lVar8 = lVar4;
        local_98[lVar8] = (char)uVar9;
        uVar9 = (ulong)(char)((byte *)pcVar10)[lVar8 + 1];
        lVar4 = lVar8 + 1;
      } while ((*(byte *)((long)puVar2 + uVar9 * 2 + 1) & 4) != 0);
      local_98[lVar8 + 1] = '\0';
      iVar5 = strcmp(local_b8,local_98);
      if (iVar5 == 0) {
        return;
      }
    }
    pIVar7 = putintoken(buf,0x143);
    pIVar7->itemtype = 0x102;
  } while( true );
}

Assistant:

void inblock(s)
	char           *s;
{				/* copy input verbatim to intoken up to END*s
				 * error if we get the whole input */
	char            *cp;
	int             l;
	Item		*q;

	l = linenum;
	for (;;) {
		cp = Gets(buf);
		if (cp == (char *) 0) {
			linenum = l;
			diag(s, " block goes to end of file");
		}
		if (isend(s, buf)) {
			break;
		}
		q = putintoken(buf, STRING);
		q->itemtype = VERBATIM;
	}
}